

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

void __thiscall
cmConditionEvaluator::cmConditionEvaluator
          (cmConditionEvaluator *this,cmMakefile *makefile,cmListFileContext *context,
          cmListFileBacktrace *bt)

{
  pointer pcVar1;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar2;
  PolicyStatus PVar3;
  
  this->Makefile = makefile;
  (this->ExecutionContext).Name._M_dataplus._M_p = (pointer)&(this->ExecutionContext).Name.field_2;
  pcVar1 = (context->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ExecutionContext,pcVar1,pcVar1 + (context->Name)._M_string_length);
  (this->ExecutionContext).FilePath._M_dataplus._M_p =
       (pointer)&(this->ExecutionContext).FilePath.field_2;
  pcVar1 = (context->FilePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->ExecutionContext).FilePath,pcVar1,
             pcVar1 + (context->FilePath)._M_string_length);
  (this->ExecutionContext).Line = context->Line;
  (this->Backtrace).Context.Name._M_dataplus._M_p = (pointer)&(this->Backtrace).Context.Name.field_2
  ;
  pcVar1 = (bt->Context).Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Backtrace,pcVar1,pcVar1 + (bt->Context).Name._M_string_length);
  (this->Backtrace).Context.Line = (bt->Context).Line;
  pcVar2 = (bt->Snapshot).Position.Tree;
  (this->Backtrace).Snapshot.State = (bt->Snapshot).State;
  (this->Backtrace).Snapshot.Position.Tree = pcVar2;
  (this->Backtrace).Snapshot.Position.Position = (bt->Snapshot).Position.Position;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0012);
  this->Policy12Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0054);
  this->Policy54Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0057);
  this->Policy57Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0064);
  this->Policy64Status = PVar3;
  return;
}

Assistant:

cmConditionEvaluator::cmConditionEvaluator(cmMakefile& makefile,
                                           const cmListFileContext &context,
                                           const cmListFileBacktrace& bt):
  Makefile(makefile),
  ExecutionContext(context),
  Backtrace(bt),
  Policy12Status(makefile.GetPolicyStatus(cmPolicies::CMP0012)),
  Policy54Status(makefile.GetPolicyStatus(cmPolicies::CMP0054)),
  Policy57Status(makefile.GetPolicyStatus(cmPolicies::CMP0057)),
  Policy64Status(makefile.GetPolicyStatus(cmPolicies::CMP0064))
{

}